

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

int Pdr_SetContainsSimple(Pdr_Set_t *pOld,Pdr_Set_t *pNew)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if ((long)pOld->nLits < 1) {
    __assert_fail("pOld->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                  ,0x130,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
  }
  if (0 < (long)pNew->nLits) {
    lVar3 = (long)pOld->nLits * 4 + 0x10;
    lVar4 = (long)pNew->nLits * 4 + 0x10;
    while( true ) {
      if (lVar4 < 0x14) {
        return 1;
      }
      iVar1 = *(int *)((long)&pOld->Sign + lVar3);
      if (iVar1 == -1) break;
      iVar2 = *(int *)((long)&pNew->Sign + lVar4);
      if (iVar2 == -1) {
        lVar4 = lVar4 + -4;
      }
      else {
        if (lVar3 < 0x14) {
          return 0;
        }
        if (iVar2 == iVar1) {
          lVar4 = lVar4 + -4;
        }
        else if (iVar1 <= iVar2) {
          return 0;
        }
        lVar3 = lVar3 + -4;
      }
    }
    __assert_fail("*pOldInt != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                  ,0x136,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
  }
  __assert_fail("pNew->nLits > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/pdr/pdrUtil.c"
                ,0x131,"int Pdr_SetContainsSimple(Pdr_Set_t *, Pdr_Set_t *)");
}

Assistant:

int Pdr_SetContainsSimple( Pdr_Set_t * pOld, Pdr_Set_t * pNew )
{
    int * pOldInt, * pNewInt;
    assert( pOld->nLits > 0 );
    assert( pNew->nLits > 0 );
    pOldInt = pOld->Lits + pOld->nLits - 1;
    pNewInt = pNew->Lits + pNew->nLits - 1;
    while ( pNew->Lits <= pNewInt )
    {
        assert( *pOldInt != -1 );
        if ( *pNewInt == -1 )
        {
            pNewInt--;
            continue;
        }
        if ( pOld->Lits > pOldInt )
            return 0;
        assert( *pNewInt != -1 );
        assert( *pOldInt != -1 );
        if ( *pNewInt == *pOldInt )
            pNewInt--, pOldInt--;
        else if ( *pNewInt < *pOldInt )
            pOldInt--;
        else
            return 0;
    }
    return 1;
}